

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_7zip_empty.c
# Opt level: O0

void test_write_format_7zip_empty_archive(void)

{
  int iVar1;
  size_t local_28;
  size_t used;
  char *buff;
  size_t buffsize;
  archive *a;
  
  buff = (char *)0x3e8;
  used = (size_t)malloc(1000);
  buffsize = (size_t)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                   ,L'*',(uint)((archive *)buffsize != (archive *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = archive_write_set_format_7zip((archive *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_7zip(a)",
                      (void *)buffsize);
  iVar1 = archive_write_add_filter_none((archive *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",
                      (void *)buffsize);
  iVar1 = archive_write_open_memory((archive *)buffsize,(void *)used,(size_t)buff,&local_28);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'.',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",(void *)buffsize);
  iVar1 = archive_write_close((archive *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'1',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
  iVar1 = archive_write_free((archive *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'2',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'5',0x20,"32",local_28,"used",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'<',(void *)used,"buff",anon_var_dwarf_42da9,
                      "\"\\x37\\x7a\\xbc\\xaf\\x27\\x1c\\x00\\x03\" \"\\x8d\\x9b\\xd5\\x0f\\x00\\x00\\x00\\x00\" \"\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\" \"\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\""
                      ,0x20,"32",(void *)0x0);
  free((void *)used);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_7zip_empty_archive)
{
	struct archive *a;
	size_t buffsize = 1000;
	char *buff;
	size_t used;

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_7zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/* Close out the archive. */
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Verify the archive file size. */
	assertEqualInt(32, used);

	/* Verify the initial header. */
	assertEqualMem(buff,
		"\x37\x7a\xbc\xaf\x27\x1c\x00\x03"
		"\x8d\x9b\xd5\x0f\x00\x00\x00\x00"
		"\x00\x00\x00\x00\x00\x00\x00\x00"
		"\x00\x00\x00\x00\x00\x00\x00\x00", 32);

	free(buff);
}